

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O2

void __thiscall CGL::OSDText::del_line(OSDText *this,int line_id)

{
  const_iterator __position;
  
  __position._M_current =
       (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
       super__Vector_impl_data._M_start;
  while( true ) {
    if (__position._M_current ==
        (this->lines).super__Vector_base<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return;
    }
    if ((__position._M_current)->id == line_id) break;
    __position._M_current = __position._M_current + 1;
  }
  std::vector<CGL::OSDLine,_std::allocator<CGL::OSDLine>_>::erase(&this->lines,__position);
  return;
}

Assistant:

void OSDText::del_line(int line_id) {
  vector<OSDLine>::iterator it = lines.begin();
  while(it != lines.end()) {
    if(it->id == line_id) {
      lines.erase(it);
      break;
    }
    ++it;
  }
}